

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encryptor_test.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  ostream *poVar2;
  ostream *this;
  long in_RSI;
  int in_EDI;
  exception *e;
  string key;
  string *in_stack_000013e0;
  undefined1 in_stack_00001cd7;
  string *in_stack_00001cd8;
  string *in_stack_00001ce0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbb8;
  allocator *__rhs;
  string local_360 [39];
  allocator local_339;
  string local_338 [32];
  string local_318 [32];
  string local_2f8 [39];
  allocator local_2d1;
  string local_2d0 [32];
  string local_2b0 [39];
  allocator local_289;
  string local_288 [32];
  string local_268 [39];
  allocator local_241;
  string local_240 [32];
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [32];
  string local_1d8 [39];
  allocator local_1b1;
  string local_1b0 [32];
  string local_190 [39];
  allocator local_169;
  string local_168 [32];
  string local_148 [39];
  allocator local_121;
  string local_120 [32];
  string local_100 [39];
  allocator local_d9;
  string local_d8 [32];
  string local_b8 [39];
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [44];
  uint local_4;
  
  local_4 = 0;
  if (in_EDI == 2) {
    pcVar1 = *(char **)(in_RSI + 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,pcVar1,&local_31);
    test_key(in_stack_000013e0);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    poVar2 = std::operator<<((ostream *)&std::cout,"- Testing basic cryptography functions");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"261965ba80a79c034c9ae366a19a2627",&local_69);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    poVar2 = std::operator<<((ostream *)&std::cout,"- Testing internal cryptography library");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"-- Testing hmac cookies signature");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"sha1",&local_91);
    std::__cxx11::string::string(local_b8,local_68);
    run_test<cppcms::sessions::impl::hmac_factory>
              (in_stack_00001ce0,in_stack_00001cd8,(bool)in_stack_00001cd7);
    std::__cxx11::string::~string(local_b8);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d8,"md5",&local_d9);
    std::__cxx11::string::string(local_100,local_68);
    run_test<cppcms::sessions::impl::hmac_factory>
              (in_stack_00001ce0,in_stack_00001cd8,(bool)in_stack_00001cd7);
    std::__cxx11::string::~string(local_100);
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    poVar2 = std::operator<<((ostream *)&std::cout,"- Testing external cryptography library");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"-- Testing hmac cookies signature");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"--- hmac-sha224");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_120,"sha224",&local_121);
    std::__cxx11::string::string(local_148,local_68);
    run_test<cppcms::sessions::impl::hmac_factory>
              (in_stack_00001ce0,in_stack_00001cd8,(bool)in_stack_00001cd7);
    std::__cxx11::string::~string(local_148);
    std::__cxx11::string::~string(local_120);
    std::allocator<char>::~allocator((allocator<char> *)&local_121);
    poVar2 = std::operator<<((ostream *)&std::cout,"--- hmac-sha256");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_168,"sha256",&local_169);
    std::__cxx11::string::string(local_190,local_68);
    run_test<cppcms::sessions::impl::hmac_factory>
              (in_stack_00001ce0,in_stack_00001cd8,(bool)in_stack_00001cd7);
    std::__cxx11::string::~string(local_190);
    std::__cxx11::string::~string(local_168);
    std::allocator<char>::~allocator((allocator<char> *)&local_169);
    poVar2 = std::operator<<((ostream *)&std::cout,"--- hmac-sha384");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1b0,"sha384",&local_1b1);
    std::__cxx11::string::string(local_1d8,local_68);
    run_test<cppcms::sessions::impl::hmac_factory>
              (in_stack_00001ce0,in_stack_00001cd8,(bool)in_stack_00001cd7);
    std::__cxx11::string::~string(local_1d8);
    std::__cxx11::string::~string(local_1b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
    poVar2 = std::operator<<((ostream *)&std::cout,"--- hmac-sha512");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1f8,"sha512",&local_1f9);
    std::__cxx11::string::string(local_220,local_68);
    run_test<cppcms::sessions::impl::hmac_factory>
              (in_stack_00001ce0,in_stack_00001cd8,(bool)in_stack_00001cd7);
    std::__cxx11::string::~string(local_220);
    std::__cxx11::string::~string(local_1f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
    poVar2 = std::operator<<((ostream *)&std::cout,"-- Testing aes cookies encryption");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"--- aes");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_240,"aes",&local_241);
    std::__cxx11::string::string(local_268,local_68);
    run_test<cppcms::sessions::impl::aes_factory>
              (in_stack_00001ce0,in_stack_00001cd8,(bool)in_stack_00001cd7);
    std::__cxx11::string::~string(local_268);
    std::__cxx11::string::~string(local_240);
    std::allocator<char>::~allocator((allocator<char> *)&local_241);
    poVar2 = std::operator<<((ostream *)&std::cout,"--- aes128");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_288,"aes128",&local_289);
    std::__cxx11::string::string(local_2b0,local_68);
    run_test<cppcms::sessions::impl::aes_factory>
              (in_stack_00001ce0,in_stack_00001cd8,(bool)in_stack_00001cd7);
    std::__cxx11::string::~string(local_2b0);
    std::__cxx11::string::~string(local_288);
    std::allocator<char>::~allocator((allocator<char> *)&local_289);
    poVar2 = std::operator<<((ostream *)&std::cout,"--- aes192");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    __rhs = &local_2d1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2d0,"aes192",__rhs);
    std::__cxx11::string::substr((ulong)local_318,(ulong)local_68);
    std::operator+(in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
    run_test<cppcms::sessions::impl::aes_factory>
              (in_stack_00001ce0,in_stack_00001cd8,(bool)in_stack_00001cd7);
    std::__cxx11::string::~string(local_2f8);
    std::__cxx11::string::~string(local_318);
    std::__cxx11::string::~string(local_2d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
    this = std::operator<<((ostream *)&std::cout,"--- aes256");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_338,"aes256",&local_339);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)poVar2,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
    run_test<cppcms::sessions::impl::aes_factory>
              (in_stack_00001ce0,in_stack_00001cd8,(bool)in_stack_00001cd7);
    std::__cxx11::string::~string(local_360);
    std::__cxx11::string::~string(local_338);
    std::allocator<char>::~allocator((allocator<char> *)&local_339);
    std::__cxx11::string::~string(local_68);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"usage: provide test directory ");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  local_4 = (uint)(in_EDI != 2);
  return local_4;
}

Assistant:

int main(int argc,char **argv)
{
	if(argc!=2) {
		std::cerr << "usage: provide test directory " << std::endl;
		return 1;
	}
	try {
		test_key(argv[1]);
		std::cout << "- Testing basic cryptography functions" << std::endl;

		std::string key="261965ba80a79c034c9ae366a19a2627";

		std::cout << "- Testing internal cryptography library" << std::endl;
		std::cout << "-- Testing hmac cookies signature" << std::endl;
		run_test<cppcms::sessions::impl::hmac_factory>("sha1",key,true);
		run_test<cppcms::sessions::impl::hmac_factory>("md5",key,true);
		#if defined(CPPCMS_HAVE_GCRYPT) || defined(CPPCMS_HAVE_OPENSSL)
		std::cout << "- Testing external cryptography library" << std::endl;
		std::cout << "-- Testing hmac cookies signature" << std::endl;
		std::cout << "--- hmac-sha224" << std::endl;
		run_test<cppcms::sessions::impl::hmac_factory>("sha224",key,true);
		std::cout << "--- hmac-sha256" << std::endl;
		run_test<cppcms::sessions::impl::hmac_factory>("sha256",key,true);
		std::cout << "--- hmac-sha384" << std::endl;
		run_test<cppcms::sessions::impl::hmac_factory>("sha384",key,true);
		std::cout << "--- hmac-sha512" << std::endl;
		run_test<cppcms::sessions::impl::hmac_factory>("sha512",key,true);
		std::cout << "-- Testing aes cookies encryption" << std::endl;
		std::cout << "--- aes" << std::endl;
		run_test<cppcms::sessions::impl::aes_factory>("aes",key);
		std::cout << "--- aes128" << std::endl;
		run_test<cppcms::sessions::impl::aes_factory>("aes128",key);
		std::cout << "--- aes192" << std::endl;
		run_test<cppcms::sessions::impl::aes_factory>("aes192",key + key.substr(16));
		std::cout << "--- aes256" << std::endl;
		run_test<cppcms::sessions::impl::aes_factory>("aes256",key + key);
		#endif
	}
	catch(std::exception const &e) {
		std::cerr << "Failed:"<<e.what()<<std::endl;
		return 1;
	}
	return 0;
}